

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

void __thiscall
Imf_3_4::IDManifest::serialize(IDManifest *this,vector<char,_std::allocator<char>_> *data)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  value_type vVar5;
  int iVar6;
  size_type sVar7;
  pointer ppVar8;
  mapped_type *pmVar9;
  pointer ppVar10;
  reference pvVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  reference pvVar15;
  reference pvVar16;
  reference pvVar17;
  size_t sVar18;
  size_type sVar19;
  reference pvVar20;
  size_type sVar21;
  reference pvVar22;
  ArgExc *this_00;
  vector<char,_std::allocator<char>_> *in_RSI;
  vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  *in_RDI;
  int idToWrite_2;
  int stringID_1;
  size_t s_2;
  uint64_t idToWrite_1;
  const_iterator i_6;
  uint64_t previousId_1;
  char scheme;
  ChannelGroupManifest *m_2;
  size_t groupNumber_1;
  int manifestIndex;
  size_t i_5;
  char *outPtr;
  int idToWrite;
  int stringID;
  size_t s_1;
  uint64_t idToStore;
  const_iterator i_4;
  bool canUse32Bits;
  uint64_t IdStorageForVariableScheme;
  uint64_t previousId;
  ChannelGroupManifest *m_1;
  size_t groupNumber;
  vector<char,_std::allocator<char>_> storageSchemes;
  int outputSize;
  pair<int,_int> newEntry;
  size_t i_3;
  int nextToInclude;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> RLEmapping;
  vector<int,_std::allocator<int>_> stringIndices;
  size_t i_2;
  size_t common;
  iterator i_1;
  int index;
  string prevString;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sortedIndices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefixedStringList;
  size_t s;
  const_iterator i;
  size_t m;
  indexedStringSet stringSet;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffa98;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffaa8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffab0;
  size_type in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  size_t in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  undefined4 uVar23;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffae0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffae8;
  char **in_stack_fffffffffffffaf0;
  size_type local_360;
  _Self local_350;
  _Self local_348;
  unsigned_long local_340;
  value_type local_331;
  const_reference local_330;
  ulong local_328;
  int local_31c;
  ulong local_318;
  reference local_310;
  undefined1 local_304;
  undefined1 local_303;
  undefined1 local_302;
  undefined1 local_301;
  int local_300;
  int local_2fc;
  ulong local_2f8;
  ulong local_2f0;
  _Self local_2e8;
  _Self local_2e0;
  byte local_2d1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_2d0;
  unsigned_long local_2c8;
  const_reference local_2c0;
  ulong local_2b8;
  vector<char,_std::allocator<char>_> local_2b0;
  int local_294;
  pair<int,_int> local_290;
  ulong local_288;
  int local_280;
  undefined4 local_27c;
  int *local_278;
  int *local_270;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_268;
  vector<int,_std::allocator<int>_> local_248;
  pair<int,_int> *local_230;
  pair<int,_int> *local_228;
  ulong local_220;
  pair<int,_int> *local_218;
  pair<int,_int> *local_210;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  ulong local_f0;
  _Self local_e8;
  _Self local_e0;
  int local_d4;
  string local_d0 [40];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  ulong local_60;
  _Self local_58;
  _Self local_50;
  ulong local_48;
  vector<char,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x1e3e44);
  for (local_48 = 0; uVar13 = local_48,
      sVar7 = std::
              vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
              ::size(in_RDI), uVar13 < sVar7; local_48 = local_48 + 1) {
    std::
    vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
    ::operator[](in_RDI,local_48);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::begin((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa98);
    while( true ) {
      std::
      vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ::operator[](in_RDI,local_48);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa98);
      bVar4 = std::operator!=(&local_50,&local_58);
      if (!bVar4) break;
      local_60 = 0;
      while( true ) {
        uVar13 = local_60;
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffffaa0);
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&ppVar8->second);
        if (sVar7 <= uVar13) break;
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffffaa0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&ppVar8->second,local_60);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](in_stack_fffffffffffffae0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        *pmVar9 = *pmVar9 + 1;
        local_60 = local_60 + 1;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffffaa0);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x1e3ff4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1e4011);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
           in_stack_fffffffffffffab8,(allocator_type *)in_stack_fffffffffffffab0._M_current);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1e403d);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x1e404a);
  std::allocator<std::pair<int,_int>_>::allocator((allocator<std::pair<int,_int>_> *)0x1e4067);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),in_stack_fffffffffffffab8
             ,(allocator_type *)in_stack_fffffffffffffab0._M_current);
  std::allocator<std::pair<int,_int>_>::~allocator((allocator<std::pair<int,_int>_> *)0x1e4093);
  std::__cxx11::string::string(local_d0);
  local_d4 = 0;
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::begin(in_stack_fffffffffffffa98);
  while( true ) {
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(in_stack_fffffffffffffa98);
    bVar4 = std::operator!=(&local_e0,&local_e8);
    if (!bVar4) break;
    if (local_d4 == 0) {
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                              *)0x1e410e);
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_88,(long)local_d4);
      std::__cxx11::string::operator=((string *)pvVar11,(string *)ppVar10);
    }
    else {
      local_f0 = 0;
      while( true ) {
        uVar13 = local_f0;
        bVar4 = false;
        if (local_f0 < 0xffff) {
          uVar12 = std::__cxx11::string::size();
          uVar2 = local_f0;
          bVar4 = false;
          if (uVar13 < uVar12) {
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                          *)0x1e4225);
            uVar13 = std::__cxx11::string::size();
            bVar4 = false;
            if (uVar2 < uVar13) {
              pcVar14 = (char *)std::__cxx11::string::operator[]((ulong)local_d0);
              cVar1 = *pcVar14;
              ppVar10 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                      *)0x1e4284);
              pcVar14 = (char *)std::__cxx11::string::operator[]((ulong)ppVar10);
              bVar4 = cVar1 == *pcVar14;
            }
          }
        }
        if (!bVar4) break;
        local_f0 = local_f0 + 1;
      }
      uVar13 = std::__cxx11::string::size();
      if (uVar13 < 0x100) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                   in_stack_fffffffffffffab8,
                   (char)((ulong)in_stack_fffffffffffffab0._M_current >> 0x38),
                   (allocator<char> *)in_stack_fffffffffffffaa8._M_current);
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                *)0x1e4581);
        std::__cxx11::string::substr((ulong)local_208,(ulong)ppVar10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                       in_stack_fffffffffffffad0);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_88,(long)local_d4);
        std::__cxx11::string::operator=((string *)pvVar11,local_1c0);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                   in_stack_fffffffffffffab8,
                   (char)((ulong)in_stack_fffffffffffffab0._M_current >> 0x38),
                   (allocator<char> *)in_stack_fffffffffffffaa8._M_current);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                   in_stack_fffffffffffffab8,
                   (char)((ulong)in_stack_fffffffffffffab0._M_current >> 0x38),
                   (allocator<char> *)in_stack_fffffffffffffaa8._M_current);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                       in_stack_fffffffffffffad0);
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                                *)0x1e43a6);
        std::__cxx11::string::substr((ulong)local_1a0,(ulong)ppVar10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                       in_stack_fffffffffffffad0);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_88,(long)local_d4);
        std::__cxx11::string::operator=((string *)pvVar11,local_110);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator(&local_179);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator(&local_151);
      }
    }
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                            *)0x1e4697);
    std::__cxx11::string::operator=(local_d0,(string *)ppVar10);
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                            *)0x1e46b6);
    iVar6 = ppVar10->second;
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,(long)local_d4);
    iVar3 = local_d4;
    pvVar15->first = -iVar6;
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,(long)local_d4);
    iVar6 = local_d4;
    pvVar15->second = iVar3;
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                            *)0x1e472b);
    ppVar10->second = iVar6;
    local_d4 = local_d4 + 1;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  *)in_stack_fffffffffffffaa0);
  }
  local_210 = (pair<int,_int> *)
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffffa98);
  local_218 = (pair<int,_int> *)
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffffa98);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  for (local_220 = 0; uVar13 = local_220,
      sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_a8), uVar13 < sVar7 && local_220 < 0x80; local_220 = local_220 + 1)
  {
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,local_220);
    pvVar15->first = 1;
  }
  for (; uVar13 = local_220,
      sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_a8), uVar13 < sVar7 && local_220 < 0x4000; local_220 = local_220 + 1
      ) {
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,local_220);
    pvVar15->first = 2;
  }
  for (; uVar13 = local_220,
      sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_a8), uVar13 < sVar7 && local_220 < 0x200000;
      local_220 = local_220 + 1) {
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,local_220);
    pvVar15->first = 3;
  }
  for (; uVar13 = local_220,
      sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_a8), uVar13 < sVar7 && local_220 < 0x10000000;
      local_220 = local_220 + 1) {
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,local_220);
    pvVar15->first = 4;
  }
  for (; uVar13 = local_220,
      sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_a8), uVar13 < sVar7; local_220 = local_220 + 1) {
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,local_220);
    pvVar15->first = 5;
  }
  local_228 = (pair<int,_int> *)
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffffa98);
  local_230 = (pair<int,_int> *)
              std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffffa98);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&local_a8);
  std::allocator<int>::allocator((allocator<int> *)0x1e4aba);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),in_stack_fffffffffffffab8
             ,(allocator_type *)in_stack_fffffffffffffab0._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x1e4ae6);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1e4af3);
  sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&local_a8);
  if (sVar7 != 0) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               in_stack_fffffffffffffab8);
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,0);
    iVar6 = pvVar15->second;
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_268,0);
    pvVar15->first = iVar6;
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,0);
    iVar6 = pvVar15->second;
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_268,0);
    pvVar15->second = iVar6;
    local_270 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa98);
    local_278 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa98);
    local_27c = 0xffffffff;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               in_stack_fffffffffffffab0._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               in_stack_fffffffffffffaa8._M_current,(int *)in_stack_fffffffffffffaa0);
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,0);
    pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_248,(long)pvVar15->second);
    *pvVar16 = 0;
    pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&local_a8,0);
    pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_248,(long)pvVar15->second);
    local_280 = *pvVar16 + 1;
    for (local_288 = 1; uVar13 = local_288,
        sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&local_a8), uVar13 < sVar7; local_288 = local_288 + 1) {
      pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (&local_a8,local_288);
      if (pvVar15->second == local_280) {
        pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[](&local_a8,local_288);
        iVar6 = pvVar15->second;
        pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
                            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             in_stack_fffffffffffffaa0);
        pvVar15->second = iVar6;
      }
      else {
        pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[](&local_a8,local_288);
        pvVar17 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[](&local_a8,local_288);
        std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_290,&pvVar15->second,&pvVar17->second);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   in_stack_fffffffffffffab0._M_current,in_stack_fffffffffffffaa8._M_current);
      }
      vVar5 = (value_type)local_288;
      pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (&local_a8,local_288);
      pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_248,(long)pvVar15->second)
      ;
      *pvVar16 = vVar5;
      pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          (&local_a8,local_288);
      local_280 = pvVar15->second;
      do {
        local_280 = local_280 + 1;
        iVar6 = local_280;
        sVar7 = std::vector<int,_std::allocator<int>_>::size(&local_248);
        bVar4 = false;
        if (iVar6 < (int)sVar7) {
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_248,(long)local_280);
          bVar4 = -1 < *pvVar16;
        }
      } while (bVar4);
    }
  }
  local_294 = 8;
  iVar6 = (anonymous_namespace)::
          getStringListSize<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  local_294 = iVar6 + local_294;
  sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&local_268);
  local_294 = local_294 + (int)(sVar7 << 3) + 4;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1e4f0d);
  for (local_2b8 = 0; uVar13 = local_2b8,
      sVar7 = std::
              vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
              ::size(in_RDI), uVar13 < sVar7; local_2b8 = local_2b8 + 1) {
    local_2c0 = std::
                vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ::operator[](in_RDI,local_2b8);
    iVar6 = (anonymous_namespace)::
            getStringListSize<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    local_294 = local_294 + iVar6;
    iVar6 = (anonymous_namespace)::
            getStringListSize<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    local_294 = local_294 + iVar6 + 1;
    iVar6 = anon_unknown_3::getStringSize((string *)0x1e4fee);
    local_294 = local_294 + iVar6;
    iVar6 = anon_unknown_3::getStringSize((string *)0x1e5019);
    local_294 = iVar6 + local_294 + 5;
    local_2c8 = 0;
    local_2d0 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)0x0;
    local_2d1 = 1;
    local_2e0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::begin((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa98);
    while( true ) {
      local_2e8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa98);
      bVar4 = std::operator!=(&local_2e0,&local_2e8);
      if (!bVar4) break;
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffaa0);
      local_2f0 = ppVar8->first - local_2c8;
      sVar18 = anon_unknown_3::getVariableLengthIntegerSize(local_2f0);
      local_2d0 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)(&(local_2d0->_M_t)._M_impl.field_0x0 + sVar18);
      if (0xffffffff < local_2f0) {
        local_2d1 = 0;
      }
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffaa0);
      local_2c8 = ppVar8->first;
      for (local_2f8 = 0; uVar13 = local_2f8,
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_2c0->_components), uVar13 < sVar7; local_2f8 = local_2f8 + 1) {
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffffaa0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&ppVar8->second,local_2f8);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](in_stack_fffffffffffffae0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        local_2fc = *pmVar9;
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_248,(long)local_2fc);
        local_300 = *pvVar16;
        in_stack_fffffffffffffaf0 =
             (char **)anon_unknown_3::getVariableLengthIntegerSize((long)local_300);
        local_294 = local_294 + (int)in_stack_fffffffffffffaf0;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffffaa0);
    }
    if ((local_2d1 & 1) == 0) {
      in_stack_fffffffffffffae0 = local_2d0;
      sVar19 = std::
               map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::size((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)0x1e5348);
      if (in_stack_fffffffffffffae0 <
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)(sVar19 << 3)) {
        local_303 = 2;
        std::vector<char,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffffaa0,(value_type_conflict *)in_stack_fffffffffffffa98);
        local_294 = local_294 + (int)local_2d0;
      }
      else {
        local_304 = 0;
        std::vector<char,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffffaa0,(value_type_conflict *)in_stack_fffffffffffffa98);
        sVar19 = std::
                 map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::size((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)0x1e53c7);
        local_294 = local_294 + (int)(sVar19 << 3);
      }
    }
    else {
      in_stack_fffffffffffffae8 = local_2d0;
      sVar19 = std::
               map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::size((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)0x1e528a);
      if (in_stack_fffffffffffffae8 <
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)(sVar19 << 2)) {
        local_301 = 2;
        std::vector<char,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffffaa0,(value_type_conflict *)in_stack_fffffffffffffa98);
        local_294 = local_294 + (int)local_2d0;
      }
      else {
        local_302 = 1;
        std::vector<char,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffffaa0,(value_type_conflict *)in_stack_fffffffffffffa98);
        sVar19 = std::
                 map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::size((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)0x1e5309);
        local_294 = local_294 + (int)(sVar19 << 2);
      }
    }
  }
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),in_stack_fffffffffffffab8
            );
  uVar23 = 0;
  local_310 = std::vector<char,_std::allocator<char>_>::operator[](local_10,0);
  Xdr::write<Imf_3_4::CharPtrIO,char*>
            ((char **)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
  (anonymous_namespace)::
  writeStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffaf0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffae8,(int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&local_268);
  Xdr::write<Imf_3_4::CharPtrIO,char*>
            ((char **)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
  local_318 = 0;
  while (uVar13 = local_318,
        sVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&local_268), uVar13 < sVar7) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
              (&local_268,local_318);
    Xdr::write<Imf_3_4::CharPtrIO,char*>
              ((char **)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
              (&local_268,local_318);
    Xdr::write<Imf_3_4::CharPtrIO,char*>
              ((char **)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    local_318 = local_318 + 1;
  }
  std::
  vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  ::size(in_RDI);
  Xdr::write<Imf_3_4::CharPtrIO,char*>
            ((char **)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
  local_31c = 0;
  local_328 = 0;
  while (uVar13 = local_328,
        sVar7 = std::
                vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ::size(in_RDI), uVar13 < sVar7) {
    local_330 = std::
                vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ::operator[](in_RDI,local_328);
    (anonymous_namespace)::
    writeStringList<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffaf0,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffae8,(int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
    (anonymous_namespace)::
    writeStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffaf0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffae8,(int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
    Xdr::write<Imf_3_4::CharPtrIO,char*>
              ((char **)in_stack_fffffffffffffaa0,(char)((ulong)in_stack_fffffffffffffa98 >> 0x38));
    anon_unknown_3::writePascalString
              ((char **)in_stack_fffffffffffffab0._M_current,
               (string *)in_stack_fffffffffffffaa8._M_current);
    anon_unknown_3::writePascalString
              ((char **)in_stack_fffffffffffffab0._M_current,
               (string *)in_stack_fffffffffffffaa8._M_current);
    pvVar20 = std::vector<char,_std::allocator<char>_>::operator[](&local_2b0,(long)local_31c);
    local_331 = *pvVar20;
    Xdr::write<Imf_3_4::CharPtrIO,char*>
              ((char **)in_stack_fffffffffffffaa0,(char)((ulong)in_stack_fffffffffffffa98 >> 0x38));
    std::
    map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::size((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x1e5663);
    Xdr::write<Imf_3_4::CharPtrIO,char*>
              ((char **)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    local_340 = 0;
    local_348._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::begin((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa98);
    while( true ) {
      local_350._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa98);
      bVar4 = std::operator!=(&local_348,&local_350);
      if (!bVar4) break;
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffaa0);
      if (local_331 == '\0') {
        Xdr::write<Imf_3_4::CharPtrIO,char*>
                  ((char **)in_stack_fffffffffffffaa0,(uint64_t)in_stack_fffffffffffffa98);
      }
      else if (local_331 == '\x01') {
        Xdr::write<Imf_3_4::CharPtrIO,char*>
                  ((char **)in_stack_fffffffffffffaa0,
                   (uint)((ulong)in_stack_fffffffffffffa98 >> 0x20));
      }
      else if (local_331 == '\x02') {
        anon_unknown_3::writeVariableLengthInteger(&local_310,ppVar8->first - local_340);
      }
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffaa0);
      local_340 = ppVar8->first;
      local_360 = 0;
      while (sVar7 = local_360,
            sVar21 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&local_330->_components), sVar7 < sVar21) {
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffffaa0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&ppVar8->second,local_360);
        in_stack_fffffffffffffab0._M_current =
             (pair<int,_int> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](in_stack_fffffffffffffae0,
                          (key_type *)CONCAT44(uVar23,in_stack_fffffffffffffad8));
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&local_248,(long)(in_stack_fffffffffffffab0._M_current)->first);
        anon_unknown_3::writeVariableLengthInteger(&local_310,(long)*pvVar16);
        local_360 = local_360 + 1;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffffaa0);
    }
    local_31c = local_31c + 1;
    local_328 = local_328 + 1;
  }
  pvVar20 = local_310;
  pvVar22 = std::vector<char,_std::allocator<char>_>::operator[](local_10,0);
  sVar7 = std::vector<char,_std::allocator<char>_>::size(local_10);
  if (pvVar20 != pvVar22 + sVar7) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Error - IDManifest size error");
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffab0._M_current);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffffab0._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0._M_current);
  std::__cxx11::string::~string(local_d0);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffffab0._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffab0._M_current);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x1e598f);
  return;
}

Assistant:

void
IDManifest::serialize (std::vector<char>& data) const
{

    indexedStringSet stringSet;

    //
    // build string map - this turns unique strings into indices
    // the manifest stores the string indices - this allows duplicated
    // strings to point to the same place
    // grabs all the strings regardless of which manifest/mapping they are in
    //
    // at this point we just count the manifest entries
    //
    {
        //
        // over each channel group
        //
        for (size_t m = 0; m < _manifest.size (); ++m)
        {
            // over each mapping
            for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                     _manifest[m]._table.begin ();
                 i != _manifest[m]._table.end ();
                 ++i)
            {
                // over each string in the mapping

                for (size_t s = 0; s < i->second.size (); ++s)
                {
                    stringSet[i->second[s]]++;
                }
            }
        }
    }

    //
    // build compressed string representation - all but first string starts with number of characters to copy from previous string.
    // max 65535 bytes - use two bytes to store if previous string was more than 255 characters, big endian
    //
    vector<string> prefixedStringList (stringSet.size ());

    //
    // also make a sorted list so the most common entry appears first. Keep equally likely entries in numerical order
    //
    vector<pair<int, int>> sortedIndices (stringSet.size ());

    string prevString;
    int    index = 0;
    for (indexedStringSet::iterator i = stringSet.begin ();
         i != stringSet.end ();
         ++i)
    {

        // no prefix on first string - map stores index of each string, so use that rather than a counter;
        if (index == 0) { prefixedStringList[index] = i->first; }
        else
        {
            size_t common = 0;
            while (common < 65535 && common < prevString.size () &&
                   common < i->first.size () &&
                   prevString[common] == i->first[common])
            {
                ++common;
            }

            if (prevString.size () > 255)
            {
                //
                // long previous string - use two bytes to encode number of common chars
                //
                prefixedStringList[index] = string (1, char (common >> 8)) +
                                            string (1, char (common & 255)) +
                                            i->first.substr (common);
            }
            else
            {
                prefixedStringList[index] =
                    string (1, char (common)) + i->first.substr (common);
            }
        }
        prevString = i->first;
        sortedIndices[index].first =
            -i->second; // use negative of count so largest count appears first
        sortedIndices[index].second = index;

        //
        // also, repurpose stringSet so that it maps from string names to indices in the string table
        //
        i->second = index;

        index++;
    }

    sort (sortedIndices.begin (), sortedIndices.end ());

    //
    // the first 1<<7 characters will all be encoded with 1 byte, regardless of how common they are
    // the next 1<<14 characters will be encoded with 2 bytes
    // (a full huffman encode would do this at the bit level, not the byte level)
    //
    // the mapping table can be reduced in size by rewriting the IDs to exploit that
    // can rearrange the IDs to have more long runs by sorting numbers
    // that will need the same number of bytes to encode together
    //
    {
        size_t i = 0;

        for (; i < sortedIndices.size () && i < 1 << 7; ++i)
        {
            sortedIndices[i].first = 1;
        }
        for (; i < sortedIndices.size () && i < 1 << 14; ++i)
        {
            sortedIndices[i].first = 2;
        }
        for (; i < sortedIndices.size () && i < 1 << 21; ++i)
        {
            sortedIndices[i].first = 3;
        }
        for (; i < sortedIndices.size () && i < 1 << 28; ++i)
        {
            sortedIndices[i].first = 4;
        }
        for (; i < sortedIndices.size (); ++i)
        {
            sortedIndices[i].first = 5;
        }
    }
    sort (sortedIndices.begin (), sortedIndices.end ());

    vector<int> stringIndices (sortedIndices.size ());

    //
    // table will be stored with RLE encoding - store pairs of 'start index,end index'
    // so, the sequence 10,11,12,1,2,3,4  is stored as [ (10,12) , (1,4)]
    //
    // sequential IDs ignore already referenced IDs, so the sequence  11,9,10,12,13 can be stored as [ (11,11) , (9,13)]
    // on reading, don't reference an entry that has already been seen
    // on writing, need to track which entries have already been stored to allow this overlapping to occur
    //

    vector<pair<int, int>> RLEmapping;

    if (sortedIndices.size () > 0)
    {
        RLEmapping.resize (1);
        RLEmapping[0].first  = sortedIndices[0].second;
        RLEmapping[0].second = sortedIndices[0].second;

        fill (stringIndices.begin (), stringIndices.end (), -1);

        stringIndices[sortedIndices[0].second] = 0;

        //
        // as the loop below runs, nextToInclude tracks the value that can be merged with the current run length
        // (RLWmapping.back()) - generally this is on more than the current length, but it jumps forward
        // over values already seen
        //
        int nextToInclude = stringIndices[sortedIndices[0].second] + 1;

        for (size_t i = 1; i < sortedIndices.size (); ++i)
        {
            if (sortedIndices[i].second == nextToInclude)
            {
                //
                // this index can be treated as part of the current run, so extend the run to include it
                //
                RLEmapping.back ().second = sortedIndices[i].second;
            }
            else
            {
                pair<int, int> newEntry (
                    sortedIndices[i].second, sortedIndices[i].second);
                RLEmapping.push_back (newEntry);
            }
            // build mapping for this entry
            stringIndices[sortedIndices[i].second] = i;

            // what would the next entry have to be to be included in this run
            // skip over already mapped strings
            nextToInclude = sortedIndices[i].second + 1;

            while (nextToInclude < int (stringIndices.size ()) &&
                   stringIndices[nextToInclude] >= 0)
            {
                nextToInclude++;
            }
        }
    }
#ifdef DUMP_TABLE
    // dump RLE table for debugging
    for (size_t i = 1; i < sortedIndices.size (); ++i)
    {
        std::cout << i << ' ' << sortedIndices[i].second << std::endl;
    }
#endif

    // now compute size of uncompressed memory block for serialization

    int outputSize =
        8; // at least need four bytes for integer to store number of channel manifests, plus four bytes to indicate version pattern

    outputSize += getStringListSize (prefixedStringList);

    //
    // RLE mapping table size - number of entries followed by eight bytes for each run length
    //
    outputSize += RLEmapping.size () * 8 + 4;

    //
    // track which storage scheme is optimal for storing the IDs of each type
    // ID storage scheme: 0 = 8 bytes per ID, 1 = 4 bytes per ID, 2 = variable
    //

    std::vector<char> storageSchemes;

    for (size_t groupNumber = 0; groupNumber < _manifest.size (); ++groupNumber)
    {
        const ChannelGroupManifest& m = _manifest[groupNumber];
        outputSize += getStringListSize (m._channels); //size of channel group
        outputSize +=
            getStringListSize (m._components); //size of component list
        outputSize += 1;                       //size of lifetime enum
        outputSize += getStringSize (m._hashScheme);
        outputSize += getStringSize (m._encodingScheme);

        outputSize += 1; // ID scheme
        outputSize +=
            4; // size of storage for number of 32 bit entries in ID table

        uint64_t previousId                 = 0;
        uint64_t IdStorageForVariableScheme = 0;
        bool     canUse32Bits               = true;
        for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                 m._table.begin ();
             i != m._table.end ();
             ++i)
        {

            uint64_t idToStore = i->first - previousId;
            IdStorageForVariableScheme +=
                getVariableLengthIntegerSize (idToStore);
            if (idToStore >= 1llu << 32) { canUse32Bits = false; }
            previousId = i->first;

            for (size_t s = 0; s < m._components.size (); ++s)
            {
                int stringID  = stringSet[i->second[s]];
                int idToWrite = stringIndices[stringID];
                outputSize += getVariableLengthIntegerSize (idToWrite);
            }
        }
        // pick best scheme to use to store IDs
        if (canUse32Bits)
        {
            if (IdStorageForVariableScheme < m._table.size () * 4)
            {
                //
                // variable storage smaller than fixed 32 bit, so use that
                //
                storageSchemes.push_back (2);
                outputSize += IdStorageForVariableScheme;
            }
            else
            {
                //
                // variable scheme bigger than fixed 32 bit, but all ID differences fit into 32 bits
                //
                storageSchemes.push_back (1);
                outputSize += m._table.size () * 4;
            }
        }
        else
        {
            if (IdStorageForVariableScheme < m._table.size () * 8)
            {
                //
                // variable storage smaller than fixed 64 bit, so use that
                //
                storageSchemes.push_back (2);
                outputSize += IdStorageForVariableScheme;
            }
            else
            {
                //
                // variable scheme bigger than fixed 64 bit, and some ID differences bigger than 32 bit
                //
                storageSchemes.push_back (0);
                outputSize += m._table.size () * 8;
            }
        }
    }

    //
    // resize output array
    //
    data.resize (outputSize);

    //
    // populate output array
    //
    char* outPtr = &data[0];

    //
    // zeroes to indicate this is version 0 of the header
    //
    Xdr::write<CharPtrIO> (outPtr, int (0));

    //
    // table of strings
    //
    writeStringList (outPtr, prefixedStringList);

    //
    // RLE block
    //
    Xdr::write<CharPtrIO> (outPtr, int (RLEmapping.size ()));
    for (size_t i = 0; i < RLEmapping.size (); ++i)
    {
        Xdr::write<CharPtrIO> (outPtr, RLEmapping[i].first);
        Xdr::write<CharPtrIO> (outPtr, RLEmapping[i].second);
    }

    //
    // number of manifests
    //
    Xdr::write<CharPtrIO> (outPtr, int (_manifest.size ()));
    int manifestIndex = 0;

    for (size_t groupNumber = 0; groupNumber < _manifest.size (); ++groupNumber)
    {
        const ChannelGroupManifest& m = _manifest[groupNumber];
        //
        // manifest header
        //
        writeStringList (outPtr, m._channels);
        writeStringList (outPtr, m._components);
        Xdr::write<CharPtrIO> (outPtr, char (m._lifeTime));
        writePascalString (outPtr, m._hashScheme);
        writePascalString (outPtr, m._encodingScheme);

        char scheme = storageSchemes[manifestIndex];
        Xdr::write<CharPtrIO> (outPtr, scheme);

        Xdr::write<CharPtrIO> (outPtr, int (m._table.size ()));

        uint64_t previousId = 0;
        //
        // table
        //
        for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                 m._table.begin ();
             i != m._table.end ();
             ++i)
        {

            uint64_t idToWrite = i->first - previousId;
            switch (scheme)
            {
                case 0: Xdr::write<CharPtrIO> (outPtr, idToWrite); break;
                case 1:
                    Xdr::write<CharPtrIO> (outPtr, (unsigned int) idToWrite);
                    break;
                case 2: writeVariableLengthInteger (outPtr, idToWrite);
            }

            previousId = i->first;

            for (size_t s = 0; s < m._components.size (); ++s)
            {
                int stringID  = stringSet[i->second[s]];
                int idToWrite = stringIndices[stringID];
                writeVariableLengthInteger (outPtr, idToWrite);
            }
        }
        manifestIndex++;
    }
    //
    // check we've written the ID manifest correctly
    //
    if (outPtr != &data[0] + data.size ())
    {
        throw IEX_NAMESPACE::ArgExc ("Error - IDManifest size error");
    }
}